

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool ScanValue(ConfigScanner *sc)

{
  char cVar1;
  _Bool _Var2;
  char *pcVar3;
  
  if (sc == (ConfigScanner *)0x0) {
    return false;
  }
  cVar1 = *sc->ptr;
  if (cVar1 == 't') {
LAB_0014c654:
    _Var2 = ScanBoolean(sc);
  }
  else {
    if ((cVar1 != '+') && (cVar1 != '-')) {
      if (cVar1 == 'f') goto LAB_0014c654;
      if (cVar1 == '\"') {
        sc->ptr = sc->ptr + 1;
        pcVar3 = GetQuote(sc);
        if (pcVar3 != (char *)0x0) {
          sc->current_string = pcVar3;
          sc->vtype = VTYPE_STRING;
          return true;
        }
        return false;
      }
      if (9 < (byte)(cVar1 - 0x30U)) {
        return false;
      }
    }
    _Var2 = ScanNumber(sc);
  }
  if (_Var2 != false) {
    return true;
  }
  return false;
}

Assistant:

bool ScanValue(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return false;
	}
	char ch = *sc->ptr;
	if (ch == '"')
	{
		sc->ptr++;
		char *value = GetQuote(sc);
		if (value == NULL)
		{
			return false;
		}
		sc->current_string = value;
		sc->vtype = VTYPE_STRING;
	}
	else if (ch == 't' || ch == 'f')
	{
		if (!ScanBoolean(sc))
		{
			return false;
		}
	}
	else if (ch == '+' || ch == '-' || (ch >= '0' && ch <= '9'))
	{
		if (!ScanNumber(sc))
		{
			return false;
		}
	}
	else
	{
		return false;
	}
	return true;
}